

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float32_eq_quiet_mips64el(float32 a,float32 b,float_status *status)

{
  float32 a_00;
  float32 a_01;
  int iVar1;
  uint32_t uVar2;
  bool local_21;
  float_status *status_local;
  float32 b_local;
  float32 a_local;
  
  a_00 = float32_squash_input_denormal_mips64el(a,status);
  a_01 = float32_squash_input_denormal_mips64el(b,status);
  iVar1 = extractFloat32Exp(a_00);
  if (((iVar1 == 0xff) && (uVar2 = extractFloat32Frac(a_00), uVar2 != 0)) ||
     ((iVar1 = extractFloat32Exp(a_01), iVar1 == 0xff &&
      (uVar2 = extractFloat32Frac(a_01), uVar2 != 0)))) {
    iVar1 = float32_is_signaling_nan_mips64el(a_00,status);
    if ((iVar1 != 0) || (iVar1 = float32_is_signaling_nan_mips64el(a_01,status), iVar1 != 0)) {
      float_raise_mips64el('\x01',status);
    }
    b_local = 0;
  }
  else {
    local_21 = a_00 == a_01 || ((a_00 | a_01) & 0x7fffffff) == 0;
    b_local = (float32)local_21;
  }
  return b_local;
}

Assistant:

int float32_eq_quiet(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    return ( float32_val(a) == float32_val(b) ) ||
            ( (uint32_t) ( ( float32_val(a) | float32_val(b) )<<1 ) == 0 );
}